

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O1

Amount __thiscall
cfd::CoinSelectionOption::GetDustFeeAmount(CoinSelectionOption *this,Address *address)

{
  uint32_t size;
  undefined1 auVar1 [12];
  bool bVar2;
  uint32_t uVar3;
  uint64_t baserate;
  Amount AVar4;
  FeeCalculator dust_fee;
  Script locking_script;
  TxOutReference txout_ref;
  TxOut txout;
  FeeCalculator local_ec;
  Script local_e8;
  AbstractTxOutReference local_b0;
  TxOut local_60;
  
  baserate = 3000;
  if (0 < this->dust_fee_rate_) {
    baserate = this->dust_fee_rate_;
  }
  FeeCalculator::FeeCalculator(&local_ec,baserate);
  core::Address::GetLockingScript(&local_e8,address);
  core::Amount::Amount((Amount *)&local_b0);
  core::TxOut::TxOut(&local_60,(Amount *)&local_b0,&local_e8);
  core::TxOutReference::TxOutReference((TxOutReference *)&local_b0,&local_60);
  uVar3 = core::AbstractTxOutReference::GetSerializeSize(&local_b0);
  bVar2 = core::Script::IsWitnessProgram(&local_e8);
  size = uVar3 + 0x43;
  if (!bVar2) {
    size = uVar3 + 0x94;
  }
  AVar4 = FeeCalculator::GetFee(&local_ec,size);
  local_b0._vptr_AbstractTxOutReference = (_func_int **)&PTR__AbstractTxOutReference_0087cca8;
  core::Script::~Script(&local_b0.locking_script_);
  local_60.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_008881b8;
  core::Script::~Script(&local_60.super_AbstractTxOut.locking_script_);
  core::Script::~Script(&local_e8);
  auVar1 = AVar4._0_12_;
  AVar4._12_4_ = 0;
  AVar4.amount_ = auVar1._0_8_;
  AVar4.ignore_check_ = (bool)auVar1[8];
  AVar4._9_3_ = auVar1._9_3_;
  return AVar4;
}

Assistant:

Amount CoinSelectionOption::GetDustFeeAmount(const Address& address) const {
  FeeCalculator dust_fee(
      (dust_fee_rate_ <= 0) ? kDustRelayTxFeeRate : dust_fee_rate_);
  Script locking_script = address.GetLockingScript();
  TxOut txout(Amount(), locking_script);
  TxOutReference txout_ref(txout);
  uint32_t size = txout_ref.GetSerializeSize();

  // Reference: bitcoin/src/policy/policy.cpp : GetDustThreshold()
  if (locking_script.IsWitnessProgram()) {
    // sum the sizes of the parts of a transaction input
    // with 75% segwit discount applied to the script size.
    size += (32 + 4 + 1 + (107 / kWitnessScaleFactor) + 4);
  } else {
    size += (32 + 4 + 1 + 107 + 4);  // the 148 mentioned above
  }
  return dust_fee.GetFee(size);
}